

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::EmbeddingNDLayerParams::SerializeWithCachedSizes
          (EmbeddingNDLayerParams *this,CodedOutputStream *output)

{
  if (this->vocabsize_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(1,this->vocabsize_,output);
  }
  if (this->embeddingsize_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(2,this->embeddingsize_,output);
  }
  if (this->hasbias_ == true) {
    google::protobuf::internal::WireFormatLite::WriteBool(3,true,output);
  }
  if (this->weights_ != (WeightParams *)0x0 &&
      this != (EmbeddingNDLayerParams *)&_EmbeddingNDLayerParams_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x14,&this->weights_->super_MessageLite,output);
  }
  if (this->bias_ != (WeightParams *)0x0 &&
      this != (EmbeddingNDLayerParams *)&_EmbeddingNDLayerParams_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x15,&this->bias_->super_MessageLite,output);
    return;
  }
  return;
}

Assistant:

void EmbeddingNDLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.EmbeddingNDLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 vocabSize = 1;
  if (this->vocabsize() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(1, this->vocabsize(), output);
  }

  // uint64 embeddingSize = 2;
  if (this->embeddingsize() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(2, this->embeddingsize(), output);
  }

  // bool hasBias = 3;
  if (this->hasbias() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(3, this->hasbias(), output);
  }

  // .CoreML.Specification.WeightParams weights = 20;
  if (this->has_weights()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      20, *this->weights_, output);
  }

  // .CoreML.Specification.WeightParams bias = 21;
  if (this->has_bias()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      21, *this->bias_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.EmbeddingNDLayerParams)
}